

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Stat4ProbeSetValue
              (Parse *pParse,Index *pIdx,UnpackedRecord **ppRec,Expr *pExpr,int nElem,int iVal,
              int *pnExtract)

{
  u8 affinity;
  int iVar1;
  Expr *pExpr_00;
  char *pcVar2;
  int i;
  ulong uVar3;
  sqlite3_value *pVal;
  ValueNewStat4Ctx alloc;
  sqlite3_value *local_68;
  long local_60;
  ulong local_58;
  ValueNewStat4Ctx local_50;
  
  if (pExpr != (Expr *)0x0) {
    iVar1 = 0;
    i = 0;
    if (pExpr->op == 0x83) goto LAB_0019d23e;
  }
  if (nElem < 1) {
    iVar1 = 0;
    i = 0;
  }
  else {
    local_60 = (long)iVal;
    local_58 = (ulong)(uint)iVal;
    uVar3 = 0;
    local_50.pParse = pParse;
    local_50.pIdx = pIdx;
    local_50.ppRec = ppRec;
    do {
      local_68 = (sqlite3_value *)0x0;
      i = (int)uVar3;
      if (pExpr == (Expr *)0x0) {
        pExpr_00 = (Expr *)0x0;
      }
      else {
        pExpr_00 = sqlite3VectorFieldSubexpr(pExpr,i);
      }
      pcVar2 = pIdx->zColAff;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = sqlite3IndexAffinityStr(pParse->db,pIdx);
        if (pcVar2 != (char *)0x0) {
          pcVar2 = pIdx->zColAff;
          goto LAB_0019d1f0;
        }
        affinity = 'A';
      }
      else {
LAB_0019d1f0:
        affinity = pcVar2[uVar3 + local_60];
      }
      local_50.iVal = (int)local_58 + i;
      iVar1 = stat4ValueFromExpr(pParse,pExpr_00,affinity,&local_50,&local_68);
    } while ((local_68 != (sqlite3_value *)0x0) &&
            (uVar3 = uVar3 + 1, i = nElem, (uint)nElem != uVar3));
  }
LAB_0019d23e:
  *pnExtract = i;
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Stat4ProbeSetValue(
  Parse *pParse,                  /* Parse context */
  Index *pIdx,                    /* Index being probed */
  UnpackedRecord **ppRec,         /* IN/OUT: Probe record */
  Expr *pExpr,                    /* The expression to extract a value from */
  int nElem,                      /* Maximum number of values to append */
  int iVal,                       /* Array element to populate */
  int *pnExtract                  /* OUT: Values appended to the record */
){
  int rc = SQLITE_OK;
  int nExtract = 0;

  if( pExpr==0 || pExpr->op!=TK_SELECT ){
    int i;
    struct ValueNewStat4Ctx alloc;

    alloc.pParse = pParse;
    alloc.pIdx = pIdx;
    alloc.ppRec = ppRec;

    for(i=0; i<nElem; i++){
      sqlite3_value *pVal = 0;
      Expr *pElem = (pExpr ? sqlite3VectorFieldSubexpr(pExpr, i) : 0);
      u8 aff = sqlite3IndexColumnAffinity(pParse->db, pIdx, iVal+i);
      alloc.iVal = iVal+i;
      rc = stat4ValueFromExpr(pParse, pElem, aff, &alloc, &pVal);
      if( !pVal ) break;
      nExtract++;
    }
  }

  *pnExtract = nExtract;
  return rc;
}